

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

void iDynTree::reportWarning(char *className,char *methodName,char *errorMessage)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[WARNING] ",10);
  if (className == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x162248);
  }
  else {
    sVar1 = strlen(className);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,className,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," :: ",4);
  if (methodName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x162248);
  }
  else {
    sVar1 = strlen(methodName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,methodName,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," : ",3);
  if (errorMessage == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x162248);
  }
  else {
    sVar1 = strlen(errorMessage);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,errorMessage,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  return;
}

Assistant:

void reportWarning(const char* className, const char* methodName, const char* errorMessage)
    {
        std::cerr << "[WARNING] " << className << " :: " << methodName << " : " << errorMessage <<  "\n";
    }